

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionContext::CollectInputUtxo
          (TransactionContext *this,vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  uint uVar4;
  size_type sVar5;
  reference pUVar6;
  undefined8 in_RSI;
  long in_RDI;
  Utxo temp;
  UtxoData dest;
  UtxoData *utxo;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__range4;
  OutPoint outpoint;
  uint32_t vout;
  Txid *txid;
  TxIn *txin_ref;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *__range2;
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *in_stack_fffffffffffff938;
  UtxoData *in_stack_fffffffffffff940;
  UtxoData *in_stack_fffffffffffff948;
  undefined6 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff956;
  undefined1 in_stack_fffffffffffff957;
  UtxoData *in_stack_fffffffffffff9a0;
  UtxoData *in_stack_fffffffffffff9a8;
  OutPoint *in_stack_fffffffffffff9b0;
  TransactionContext *in_stack_fffffffffffff9b8;
  __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
  local_a8;
  undefined8 local_a0;
  OutPoint local_98;
  uint local_5c;
  Txid local_58;
  Txid *local_38;
  reference local_30;
  TxIn *local_28;
  __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_20;
  long local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar1 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::empty
                    ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                     CONCAT17(in_stack_fffffffffffff957,
                              CONCAT16(in_stack_fffffffffffff956,in_stack_fffffffffffff950)));
  if (!bVar1) {
    sVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::size
                      ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)(in_RDI + 0x40));
    uVar4 = cfd::core::Transaction::GetTxInCount();
    if (sVar5 != uVar4) {
      local_18 = in_RDI + 0x10;
      local_20._M_current =
           (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::begin
                             (in_stack_fffffffffffff938);
      local_28 = (TxIn *)std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::end
                                   (in_stack_fffffffffffff938);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                                 *)in_stack_fffffffffffff940,
                                (__normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                                 *)in_stack_fffffffffffff938), bVar1) {
        local_30 = __gnu_cxx::
                   __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
                   ::operator*(&local_20);
        cfd::core::AbstractTxIn::GetTxid();
        local_38 = &local_58;
        local_5c = cfd::core::AbstractTxIn::GetVout();
        cfd::core::OutPoint::OutPoint(&local_98,local_38,local_5c);
        uVar2 = IsFindUtxoMap(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                              in_stack_fffffffffffff9a8);
        if (!(bool)uVar2) {
          local_a0 = local_10;
          local_a8._M_current =
               (UtxoData *)
               std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::begin
                         ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                          in_stack_fffffffffffff938);
          std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::end
                    ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                     in_stack_fffffffffffff938);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                                     *)in_stack_fffffffffffff940,
                                    (__normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                                     *)in_stack_fffffffffffff938), bVar1) {
            pUVar6 = __gnu_cxx::
                     __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
                     ::operator*(&local_a8);
            if ((pUVar6->vout == local_5c) &&
               (bVar3 = cfd::core::Txid::Equals(&pUVar6->txid), (bVar3 & 1) != 0)) {
              UtxoData::UtxoData(in_stack_fffffffffffff9a0);
              in_stack_fffffffffffff938 =
                   (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0;
              in_stack_fffffffffffff940 = (UtxoData *)0x0;
              in_stack_fffffffffffff9b8 = (TransactionContext *)0x0;
              in_stack_fffffffffffff9a8 = (UtxoData *)0x0;
              in_stack_fffffffffffff9b0 = (OutPoint *)0x0;
              in_stack_fffffffffffff9a0 = (UtxoData *)0x0;
              UtxoUtil::ConvertToUtxo
                        ((UtxoData *)dest.value_commitment._32_8_,
                         (Utxo *)dest.value_commitment.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (UtxoData *)
                         dest.value_commitment.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish);
              std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
                        ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
                         CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffff950)),
                         in_stack_fffffffffffff948);
              UtxoData::~UtxoData(in_stack_fffffffffffff940);
              break;
            }
            __gnu_cxx::
            __normal_iterator<const_cfd::UtxoData_*,_std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>_>
            ::operator++(&local_a8);
          }
        }
        core::OutPoint::~OutPoint((OutPoint *)0x3ae27a);
        core::Txid::~Txid((Txid *)0x3ae287);
        __gnu_cxx::
        __normal_iterator<cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
        ::operator++(&local_20);
      }
    }
  }
  return;
}

Assistant:

void TransactionContext::CollectInputUtxo(const std::vector<UtxoData>& utxos) {
  if ((!utxos.empty()) && (utxo_map_.size() != GetTxInCount())) {
    for (const auto& txin_ref : vin_) {
      const Txid& txid = txin_ref.GetTxid();
      uint32_t vout = txin_ref.GetVout();

      OutPoint outpoint(txid, vout);
      if (!IsFindUtxoMap(outpoint)) {
        for (const auto& utxo : utxos) {
          if ((utxo.vout == vout) && utxo.txid.Equals(txid)) {
            UtxoData dest;
            Utxo temp;
            memset(&temp, 0, sizeof(temp));
            UtxoUtil::ConvertToUtxo(utxo, &temp, &dest);
            utxo_map_.emplace_back(dest);
            break;
          }
        }
      }
    }
  }
}